

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

void __thiscall
spvtools::utils::
HexFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>
::
castTo<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>>
          (HexFloat<spvtools::utils::FloatProxy<float>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>>>
           *this,HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                 *other,round_direction round_dir)

{
  HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
  *pHVar1;
  ushort uVar2;
  uint_type uVar3;
  bool bVar4;
  bool local_7d;
  ushort local_7c;
  bool local_5c;
  bool local_5b;
  bool local_5a;
  bool local_59;
  FloatProxy<spvtools::utils::Float16> local_40;
  ushort local_3e;
  FloatProxy<spvtools::utils::Float16> local_3c;
  bool local_3a;
  bool round_underflow_up;
  uint uStack_38;
  uint_type shifted_significand;
  bool is_inf;
  int iStack_34;
  bool is_nan;
  uint_type check_bit;
  int_type exponent;
  uint_type rounded_significand;
  FloatProxy<spvtools::utils::Float16> FStack_26;
  bool carried;
  uint_type significand;
  FloatProxy<spvtools::utils::Float16> local_20;
  FloatProxy<spvtools::utils::Float16> local_1e;
  round_direction rStack_1c;
  bool negate;
  HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
  *pHStack_18;
  round_direction round_dir_local;
  HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
  *other_local;
  HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
  *this_local;
  
  rStack_1c = round_dir;
  pHStack_18 = other;
  other_local = (HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                 *)this;
  FloatProxy<spvtools::utils::Float16>::FloatProxy(&local_20,0);
  HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
  ::HexFloat((HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
              *)&local_1e,local_20);
  (pHStack_18->value_).data_ = local_1e.data_;
  significand._3_1_ =
       HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
       ::isNegative((HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                     *)this);
  uVar3 = HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
          ::getUnsignedBits((HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                             *)this);
  pHVar1 = pHStack_18;
  if (uVar3 == 0) {
    if ((significand._3_1_ & 1) != 0) {
      FStack_26 = HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
                  ::value(pHStack_18);
      significand._0_2_ = FloatProxy<spvtools::utils::Float16>::operator-(&stack0xffffffffffffffda);
      HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
      ::set_value(pHVar1,significand._0_2_);
    }
  }
  else {
    exponent = HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
               ::getSignificandBits
                         ((HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                           *)this);
    check_bit._3_1_ = 0;
    check_bit._0_2_ =
         getRoundedNormalizedSignificand<spvtools::utils::HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>>>>
                   (this,rStack_1c,(bool *)((long)&check_bit + 3));
    iStack_34 = HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                ::getUnbiasedExponent
                          ((HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                            *)this);
    if (iStack_34 == -0x7f) {
      iStack_34 = -0x7e;
      for (uStack_38 = 0x400000;
          (uStack_38 != 0 && (iStack_34 = iStack_34 + -1, (uStack_38 & exponent) == 0));
          uStack_38 = uStack_38 >> 1) {
      }
    }
    uVar3 = HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
            ::getBits((HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                       *)this);
    bVar4 = (uVar3 & 0x7f800000) == 0x7f800000;
    local_59 = bVar4 && exponent != 0;
    round_underflow_up = local_59;
    local_5a = false;
    if (!bVar4 || exponent == 0) {
      local_5b = true;
      if ((int)(iStack_34 + (uint)(check_bit._3_1_ & 1)) < 0x10) {
        local_5c = false;
        if (exponent == 0) {
          uVar3 = HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                  ::getBits((HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                             *)this);
          local_5c = (uVar3 & 0x7f800000) == 0x7f800000;
        }
        local_5b = local_5c;
      }
      local_5a = local_5b;
    }
    pHVar1 = pHStack_18;
    local_3a = local_5a;
    if (local_5a == false) {
      if ((round_underflow_up & 1U) == 0) {
        bVar4 = HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                ::isNegative((HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                              *)this);
        if (bVar4) {
          local_7d = rStack_1c == kToNegativeInfinity;
        }
        else {
          local_7d = rStack_1c == kToPositiveInfinity;
        }
        HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
        ::setFromSignUnbiasedExponentAndNormalizedSignificand
                  (pHStack_18,(bool)(significand._3_1_ & 1),(int_type)iStack_34,(uint_type)check_bit
                   ,local_7d);
      }
      else {
        uVar3 = HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                ::negatable_left_shift<-13,_void>::val(exponent);
        pHVar1 = pHStack_18;
        local_3e = (ushort)uVar3;
        uVar2 = 0;
        if ((significand._3_1_ & 1) != 0) {
          uVar2 = 0x8000;
        }
        local_7c = local_3e;
        if (local_3e == 0) {
          local_7c = 1;
        }
        FloatProxy<spvtools::utils::Float16>::FloatProxy(&local_40,uVar2 | 0x7c00 | local_7c);
        HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
        ::set_value(pHVar1,local_40);
      }
    }
    else {
      uVar2 = 0;
      if ((significand._3_1_ & 1) != 0) {
        uVar2 = 0x8000;
      }
      FloatProxy<spvtools::utils::Float16>::FloatProxy(&local_3c,uVar2 | 0x7c00);
      HexFloat<spvtools::utils::FloatProxy<spvtools::utils::Float16>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<spvtools::utils::Float16>_>_>
      ::set_value(pHVar1,local_3c);
    }
  }
  return;
}

Assistant:

void castTo(other_T& other, round_direction round_dir) {
    other = other_T(static_cast<typename other_T::native_type>(0));
    bool negate = isNegative();
    if (getUnsignedBits() == 0) {
      if (negate) {
        other.set_value(-other.value());
      }
      return;
    }
    uint_type significand = getSignificandBits();
    bool carried = false;
    typename other_T::uint_type rounded_significand =
        getRoundedNormalizedSignificand<other_T>(round_dir, &carried);

    int_type exponent = getUnbiasedExponent();
    if (exponent == min_exponent) {
      // If we are denormal, normalize the exponent, so that we can encode
      // easily.
      exponent = static_cast<int_type>(exponent + 1);
      for (uint_type check_bit = first_exponent_bit >> 1; check_bit != 0;
           check_bit = static_cast<uint_type>(check_bit >> 1)) {
        exponent = static_cast<int_type>(exponent - 1);
        if (check_bit & significand) break;
      }
    }

    bool is_nan =
        (getBits() & exponent_mask) == exponent_mask && significand != 0;
    bool is_inf =
        !is_nan &&
        ((exponent + carried) > static_cast<int_type>(other_T::exponent_bias) ||
         (significand == 0 && (getBits() & exponent_mask) == exponent_mask));

    // If we are Nan or Inf we should pass that through.
    if (is_inf) {
      other.set_value(typename other_T::underlying_type(
          static_cast<typename other_T::uint_type>(
              (negate ? other_T::sign_mask : 0) | other_T::exponent_mask)));
      return;
    }
    if (is_nan) {
      typename other_T::uint_type shifted_significand;
      shifted_significand = static_cast<typename other_T::uint_type>(
          negatable_left_shift<
              static_cast<int_type>(other_T::num_fraction_bits) -
              static_cast<int_type>(num_fraction_bits)>::val(significand));

      // We are some sort of Nan. We try to keep the bit-pattern of the Nan
      // as close as possible. If we had to shift off bits so we are 0, then we
      // just set the last bit.
      other.set_value(typename other_T::underlying_type(
          static_cast<typename other_T::uint_type>(
              (negate ? other_T::sign_mask : 0) | other_T::exponent_mask |
              (shifted_significand == 0 ? 0x1 : shifted_significand))));
      return;
    }

    bool round_underflow_up =
        isNegative() ? round_dir == round_direction::kToNegativeInfinity
                     : round_dir == round_direction::kToPositiveInfinity;
    using other_int_type = typename other_T::int_type;
    // setFromSignUnbiasedExponentAndNormalizedSignificand will
    // zero out any underflowing value (but retain the sign).
    other.setFromSignUnbiasedExponentAndNormalizedSignificand(
        negate, static_cast<other_int_type>(exponent), rounded_significand,
        round_underflow_up);
    return;
  }